

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O1

void __thiscall FixedElement::~FixedElement(FixedElement *this)

{
  _Atomic_word *p_Var1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  this->_vptr_FixedElement = (_func_int **)&PTR___cxa_pure_virtual_001a73f0;
  pcVar2 = (this->gene_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->gene_).field_2) {
    operator_delete(pcVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&(this->interactions_)._M_t);
  pcVar2 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name_).field_2) {
    operator_delete(pcVar2);
  }
  p_Var3 = (this->super_enable_shared_from_this<FixedElement>)._M_weak_this.
           super___weak_ptr<FixedElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

BindingSite::BindingSite(const std::string &name, int start, int stop,
                         const std::map<std::string, double> &interactions)
    : FixedElement(name, start, stop, interactions) {
  first_exposure_ = false;
  for (auto const &item : interactions) {
    if (item.second < 0) {
      throw std::invalid_argument(
          "Binding site '" + name_ +
          "' must have non-negative interaction rate constants.");
    }
  }
}